

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# happly.h
# Opt level: O0

void __thiscall
happly::TypedListProperty<unsigned_char>::writeDataBinaryBigEndian
          (TypedListProperty<unsigned_char> *this,ostream *outStream,size_t iElement)

{
  byte bVar1;
  reference pvVar2;
  ulong uVar3;
  runtime_error *this_00;
  size_type in_RDX;
  char *in_RSI;
  long in_RDI;
  uchar value;
  size_t iFlat;
  uint8_t count;
  size_t dataCount;
  size_t dataEnd;
  size_t dataStart;
  uchar local_49;
  value_type local_48;
  undefined1 local_3d [13];
  ulong local_30;
  value_type local_28;
  value_type local_20;
  size_type local_18;
  char *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x40),
                      in_RDX);
  local_20 = *pvVar2;
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x40),
                      local_18 + 1);
  local_28 = *pvVar2;
  uVar3 = local_28 - local_20;
  local_30 = uVar3;
  bVar1 = geometrycentral::surface::std::numeric_limits<unsigned_char>::max();
  if (bVar1 < uVar3) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,
               "List property has an element with more entries than fit in a uchar. See note in README."
              );
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_3d[0] = (undefined1)local_30;
  std::ostream::write(local_10,(long)local_3d);
  for (local_48 = local_20; local_48 < local_28; local_48 = local_48 + 1) {
    geometrycentral::surface::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x28),local_48);
    local_49 = anon_unknown_3::swapEndian<unsigned_char>((uchar)((ulong)in_RDI >> 0x38));
    std::ostream::write(local_10,(long)&local_49);
  }
  return;
}

Assistant:

virtual void writeDataBinaryBigEndian(std::ostream& outStream, size_t iElement) override {
    size_t dataStart = flattenedIndexStart[iElement];
    size_t dataEnd = flattenedIndexStart[iElement + 1];

    // Get the number of list elements as a uchar, and ensure the value fits
    size_t dataCount = dataEnd - dataStart;
    if (dataCount > std::numeric_limits<uint8_t>::max()) {
      throw std::runtime_error(
          "List property has an element with more entries than fit in a uchar. See note in README.");
    }
    uint8_t count = static_cast<uint8_t>(dataCount);

    outStream.write((char*)&count, sizeof(uint8_t));
    for (size_t iFlat = dataStart; iFlat < dataEnd; iFlat++) {
      T value = swapEndian(flattenedData[iFlat]);
      outStream.write((char*)&value, sizeof(T));
    }
  }